

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::loop(EventLoop *this)

{
  bool bVar1;
  int v;
  LogStream *pLVar2;
  element_type *this_00;
  element_type *this_01;
  reference psVar3;
  element_type *peVar4;
  EventLoop *pEVar5;
  Logger local_1ff8;
  undefined1 local_1020 [8];
  shared_ptr<Channel> channel;
  iterator __end2;
  iterator __begin2;
  ChannelList *__range2;
  Logger local_fe8;
  EventLoop *local_10;
  EventLoop *this_local;
  
  local_10 = this;
  if (((this->looping_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!looping_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                  ,0x2f,"void EventLoop::loop()");
  }
  assertInLoopThread(this);
  this->looping_ = true;
  Logger::Logger(&local_fe8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                 ,0x32);
  pLVar2 = Logger::stream(&local_fe8);
  pLVar2 = LogStream::operator<<(pLVar2,"Thread ");
  pLVar2 = LogStream::operator<<(pLVar2,this->threadId_);
  LogStream::operator<<(pLVar2," start looping");
  Logger::~Logger(&local_fe8);
  this->quit_ = false;
  while (((this->quit_ ^ 0xffU) & 1) != 0) {
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::clear
              (&this->activeChannels_);
    this_00 = std::__shared_ptr_access<TimerHeap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<TimerHeap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )&this->timer_);
    TimerHeap::setTimeFlag(this_00);
    this_01 = std::__shared_ptr_access<EPoller,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<EPoller,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &this->poller_);
    EPoller::epoll(this_01,-1,&this->activeChannels_);
    __end2 = std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::
             begin(&this->activeChannels_);
    channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::end
                   (&this->activeChannels_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::shared_ptr<Channel>_*,_std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>_>
                                  *)&channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
      if (!bVar1) break;
      psVar3 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Channel>_*,_std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>_>
               ::operator*(&__end2);
      std::shared_ptr<Channel>::shared_ptr((shared_ptr<Channel> *)local_1020,psVar3);
      peVar4 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_1020);
      pEVar5 = Channel::ownerLoop(peVar4);
      if (pEVar5 == this) {
        peVar4 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1020);
        Channel::handleEvent(peVar4);
      }
      std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)local_1020);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Channel>_*,_std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>_>
      ::operator++(&__end2);
    }
    doPendingFuntors(this);
  }
  Logger::Logger(&local_1ff8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                 ,0x3f);
  pLVar2 = Logger::stream(&local_1ff8);
  pLVar2 = LogStream::operator<<(pLVar2,"EventLoop in thread ");
  v = CurrentThread::tid();
  pLVar2 = LogStream::operator<<(pLVar2,v);
  LogStream::operator<<(pLVar2," stop looping");
  Logger::~Logger(&local_1ff8);
  this->looping_ = false;
  return;
}

Assistant:

void EventLoop::loop() {
    assert(!looping_);
    assertInLoopThread();
    looping_ = true;
    LOG <<"Thread " << threadId_ << " start looping";
    quit_ = false;
    while (!quit_) {
        activeChannels_.clear();
        timer_->setTimeFlag();
        poller_->epoll(-1, &activeChannels_);
        for (auto channel: activeChannels_) {
            if (channel->ownerLoop() == this)
                channel->handleEvent();
        }
        doPendingFuntors();
    }

    LOG << "EventLoop in thread " << CurrentThread::tid() << " stop looping";
    looping_ = false;
}